

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O0

bool Image_Function::
     IsFullImageRow<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (uint32_t width,ImageTemplate<unsigned_char> *image,
               ImageTemplate<unsigned_char> *args,ImageTemplate<unsigned_char> *args_1)

{
  bool bVar1;
  undefined4 in_EDI;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  ImageTemplate<unsigned_char> *image_00;
  uint32_t in_stack_ffffffffffffff90;
  ImageTemplate<unsigned_char> local_48;
  undefined4 local_8;
  byte local_1;
  
  local_8 = in_EDI;
  bVar1 = IsFullImageRow<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
  if (bVar1) {
    image_00 = &local_48;
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)CONCAT44(local_8,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    local_1 = IsFullImageRow<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                        (in_stack_ffffffffffffff90,image_00,
                         (ImageTemplate<unsigned_char> *)CONCAT44(local_8,in_stack_ffffffffffffff80)
                        );
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x140045);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool IsFullImageRow( uint32_t width, const TImage & image, Args... args )
    {
        if( !IsFullImageRow( width, image ) )
            return false;

        return IsFullImageRow( width, args... );
    }